

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O1

long go(void)

{
  pointer pfVar1;
  long lVar2;
  long lVar3;
  int in_ECX;
  Section *in_RDX;
  future<void> *t;
  __basic_future<void> *this;
  ImageSize *in_RSI;
  ImageSize *__stat_loc;
  _Tuple_impl<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
  *in_RDI;
  Gradient *in_R8;
  int in_R9D;
  int iVar4;
  int in_stack_00000008;
  vector<double,_std::allocator<double>_> durations;
  vector<int,_std::allocator<int>_> combined_iterations_histogram;
  vector<PixelColor,_std::allocator<PixelColor>_> image_data;
  vector<CalculationResult,_std::allocator<CalculationResult>_> results_per_point;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  iteration_histograms_per_thread;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> threads;
  vector<double,_std::allocator<double>_> local_e8;
  vector<int,_std::allocator<int>_> local_c8;
  vector<PixelColor,_std::allocator<PixelColor>_> local_b0;
  vector<CalculationResult,_std::allocator<CalculationResult>_> local_98;
  _Tuple_impl<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
  *local_80;
  Gradient *local_78;
  Section *local_70;
  double local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_48;
  
  local_78 = in_R8;
  local_70 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,(long)(in_ECX + 1),(allocator_type *)&local_98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_60,(long)in_stack_00000008,&local_c8,(allocator_type *)&local_b0);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,(long)(in_ECX + 1),(allocator_type *)&local_98);
  std::vector<CalculationResult,_std::allocator<CalculationResult>_>::vector
            (&local_98,(long)in_RSI->height * (long)in_RSI->width,(allocator_type *)&local_b0);
  std::vector<PixelColor,_std::allocator<PixelColor>_>::vector
            (&local_b0,(long)in_RSI->height * (long)in_RSI->width,(allocator_type *)&local_e8);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_80 = in_RDI;
  if (0 < in_R9D) {
    iVar4 = 0;
    do {
      lVar2 = std::chrono::_V2::system_clock::now();
      __stat_loc = in_RSI;
      start_threads(&local_48,in_RSI,local_70,in_ECX,&local_60,&local_98,in_stack_00000008);
      pfVar1 = local_48.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (this = &(local_48.
                    super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super___basic_future<void>;
          this != &pfVar1->super___basic_future<void>; this = this + 1) {
        std::__basic_future<void>::wait(this,__stat_loc);
      }
      combine_iteration_histograms(&local_60,&local_c8);
      mandelbrot_colorize(in_ECX,local_78,&local_b0,&local_c8,&local_98);
      lVar3 = std::chrono::_V2::system_clock::now();
      local_68 = (double)(lVar3 - lVar2) / 1000000000.0;
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_68);
      }
      else {
        *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_68;
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_48);
      iVar4 = iVar4 + 1;
    } while (iVar4 != in_R9D);
  }
  std::
  _Tuple_impl<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<PixelColor,std::allocator<PixelColor>>&,std::vector<double,std::allocator<double>>&,void>
            (local_80,&local_b0,&local_e8);
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  return (long)local_80;
}

Assistant:

auto go(const ImageSize& image, const Section& section, const int max_iterations, const Gradient& gradient, const int repetitions, const int num_threads) noexcept
{
    // iterations_histogram: for simplicity we only use indices [1] .. [max_iterations], [0] is unused
    std::vector<std::vector<int>> iteration_histograms_per_thread(static_cast<std::size_t>(num_threads), std::vector<int>(static_cast<std::size_t>(max_iterations + 1)));
    std::vector<int> combined_iterations_histogram(static_cast<std::size_t>(max_iterations + 1));

    // For every point store a tuple consisting of the final iteration and (for escaped points)
    // the distance to the next iteration (as value of 0.0 .. 1.0).
    std::vector<CalculationResult> results_per_point(static_cast<std::size_t>(image.width * image.height));

    std::vector<PixelColor> image_data(static_cast<std::size_t>(image.width * image.height));
    std::vector<double> durations;

    for (int i = 0; i < repetitions; ++i) {
        const auto t1 = std::chrono::high_resolution_clock::now();

        auto threads = start_threads(image, section, max_iterations, iteration_histograms_per_thread, results_per_point, num_threads);
        wait_for_threads_to_finish(threads);
        combine_iteration_histograms(iteration_histograms_per_thread, combined_iterations_histogram);
        mandelbrot_colorize(max_iterations, gradient, image_data, combined_iterations_histogram, results_per_point);

        const auto t2 = std::chrono::high_resolution_clock::now();
        durations.push_back(std::chrono::duration<double>{t2 - t1}.count());
    }

    return std::make_tuple(image_data, durations);
}